

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

void __thiscall
TimerTest_scopedWithIterations_Test::TestBody(TimerTest_scopedWithIterations_Test *this)

{
  undefined8 uVar1;
  char *pcVar2;
  timer timer_obj;
  promise<void> promise;
  size_t iterations;
  future_status local_90 [2];
  __basic_future<void> local_88;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  future_status local_64;
  timer local_60;
  promise<void> local_50;
  undefined8 *local_38;
  promise<void> *local_30;
  code *local_28;
  code *local_20;
  undefined8 local_18;
  
  local_18 = 0;
  std::promise<void>::promise(&local_50);
  local_20 = std::
             _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:93:45)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:93:45)>
             ::_M_manager;
  local_38 = &local_18;
  local_30 = &local_50;
  jessilib::timer::timer(&local_60,1000000,4);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  std::__basic_future<void>::__basic_future(&local_88,&local_50._M_future);
  if (local_88._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    local_90[0] = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000000000l>>
                            (local_88._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,&timeout);
    local_64 = ready;
    testing::internal::CmpHelperEQ<std::future_status,std::future_status>
              (local_78,"promise.get_future().wait_for(timeout)","std::future_status::ready",
               local_90,&local_64);
    if (local_88._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
                 ,99,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_88._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (_State_baseV2 *)0x0) {
        (*(local_88._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr__State_baseV2[1])();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    if (local_60.m_context.
        super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.m_context.
                 super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::promise<void>::~promise(&local_50);
    return;
  }
  uVar1 = std::__throw_future_error(3);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
  if (local_88._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    (*(local_88._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr__State_baseV2[1])();
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  if (local_60.m_context.
      super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.m_context.
               super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<void>::~promise(&local_50);
  _Unwind_Resume(uVar1);
}

Assistant:

TEST(TimerTest, scopedWithIterations) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	timer timer_obj{ period, total_iterations, [&iterations, &promise]([[maybe_unused]] timer& in_timer) {
		if (++iterations == total_iterations) {
			promise.set_value();
		}
	} };

	EXPECT_EQ(promise.get_future().wait_for(timeout), std::future_status::ready);
}